

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O0

size_t stumpless_get_element_count(stumpless_entry *entry)

{
  size_t count;
  stumpless_entry *entry_local;
  
  if (entry == (stumpless_entry *)0x0) {
    raise_argument_empty("entry was NULL");
    entry_local = (stumpless_entry *)0x0;
  }
  else {
    lock_entry(entry);
    entry_local = (stumpless_entry *)entry->element_count;
    unlock_entry(entry);
  }
  return (size_t)entry_local;
}

Assistant:

size_t
stumpless_get_element_count( const struct stumpless_entry *entry ) {
  size_t count;

  VALIDATE_ARG_NOT_NULL_UNSIGNED_RETURN( entry );

  lock_entry( entry );
  count = entry->element_count;
  unlock_entry( entry );

  return count;
}